

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

int ParseExpMinMax(char **p,aint *nval)

{
  int iVar1;
  int iVar2;
  int local_38;
  int local_34;
  int local_28;
  int oper;
  aint right;
  aint left;
  aint *nval_local;
  char **p_local;
  
  _right = nval;
  nval_local = (aint *)p;
  iVar1 = ParseExpShift(p,&oper);
  if (iVar1 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    while (iVar1 = need((char **)nval_local,"<?>?"), iVar1 != 0) {
      iVar2 = ParseExpShift((char **)nval_local,&local_28);
      if (iVar2 == 0) {
        return 0;
      }
      if (iVar1 == 0x7b) {
        if (oper < local_28) {
          local_34 = oper;
        }
        else {
          local_34 = local_28;
        }
        oper = local_34;
      }
      else if (iVar1 == 0x7d) {
        if (local_28 < oper) {
          local_38 = oper;
        }
        else {
          local_38 = local_28;
        }
        oper = local_38;
      }
      else {
        Error("internal error",(char *)0x0,FATAL);
      }
    }
    *_right = oper;
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

static int ParseExpMinMax(char*& p, aint& nval) {
	aint left, right;
	int oper;
	if (!ParseExpShift(p, left)) return 0;
	while ((oper = need(p, "<?>?"))) {
		if (!ParseExpShift(p, right)) return 0;
		switch (oper) {
		case '<'+'?':
			left = left < right ? left : right; break;
		case '>'+'?':
			left = left > right ? left : right; break;
		default: Error("internal error", nullptr, FATAL); break;	// unreachable
		}
	}
	nval = left;
	return 1;
}